

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcApi.c
# Opt level: O0

int Mvc_CoverIsTautology(Mvc_Cover_t *pCover)

{
  int iVar1;
  Mvc_Cube_t *pMVar2;
  int local_24;
  int Value;
  int iBit;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pCover_local;
  
  iVar1 = Mvc_CoverReadCubeNum(pCover);
  if (iVar1 == 1) {
    pMVar2 = Mvc_CoverReadCubeHead(pCover);
    for (local_24 = 0; local_24 < pCover->nBits; local_24 = local_24 + 1) {
      if ((pMVar2->pData[local_24 >> 5] & 1 << ((byte)local_24 & 0x1f)) == 0) {
        return 0;
      }
    }
    pCover_local._4_4_ = 1;
  }
  else {
    pCover_local._4_4_ = 0;
  }
  return pCover_local._4_4_;
}

Assistant:

int Mvc_CoverIsTautology( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int iBit, Value;

    if ( Mvc_CoverReadCubeNum(pCover) != 1 )
        return 0;

    pCube = Mvc_CoverReadCubeHead( pCover );
    Mvc_CubeForEachBit( pCover, pCube, iBit, Value )
        if ( Value == 0 )
            return 0;
    return 1;
}